

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_bound_suite.cpp
# Opt level: O0

void find_u16string(void)

{
  index_type *this;
  undefined4 local_4cc;
  iterator local_4c8;
  iterator local_4b0;
  difference_type local_498 [2];
  iterator local_488;
  iterator local_470;
  undefined1 local_458 [8];
  iterator where_7;
  iterator local_438;
  iterator local_420;
  difference_type local_408 [2];
  iterator local_3f8;
  iterator local_3e0;
  undefined1 local_3c8 [8];
  iterator where_6;
  iterator local_3a8;
  iterator local_390;
  difference_type local_378 [2];
  iterator local_368;
  iterator local_350;
  undefined1 local_338 [8];
  iterator where_5;
  iterator local_318;
  iterator local_300;
  difference_type local_2e8 [2];
  iterator local_2d8;
  iterator local_2c0;
  undefined1 local_2a8 [8];
  iterator where_4;
  iterator local_288;
  iterator local_270;
  difference_type local_258 [2];
  double local_248;
  iterator local_240;
  iterator local_228;
  undefined1 local_210 [8];
  iterator where_3;
  iterator local_1f0;
  iterator local_1d8;
  difference_type local_1c0;
  int local_1b4;
  iterator local_1b0;
  iterator local_198;
  undefined1 local_180 [8];
  iterator where_2;
  iterator local_160;
  iterator local_148;
  difference_type local_130;
  bool local_121;
  iterator local_120;
  iterator local_108;
  undefined1 local_f0 [8];
  iterator where_1;
  iterator local_d0;
  iterator local_b8;
  difference_type local_a0;
  nullable local_94;
  iterator local_90;
  iterator local_68;
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  this = &where.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)this,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_68,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_90,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_94 = null;
  std::
  lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::nullable>
            ((iterator *)local_50,&local_68,&local_90,&local_94);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_d0,(iterator *)local_50);
  local_a0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                       (&local_b8,&local_d0);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0xf8,"void find_u16string()",&local_a0,
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_108,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_120,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_121 = true;
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
            ((iterator *)local_f0,&local_108,&local_120,&local_121);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_148,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_160,(iterator *)local_f0);
  local_130 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_148,&local_160);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0xfc,"void find_u16string()",&local_130,
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_198,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1b0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_1b4 = 2;
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            ((iterator *)local_180,&local_198,&local_1b0,&local_1b4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1f0,(iterator *)local_180);
  local_1c0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_1d8,&local_1f0);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0x100,"void find_u16string()",&local_1c0,
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_228,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_240,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_248 = 3.0;
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
            ((iterator *)local_210,&local_228,&local_240,&local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_270,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_288,(iterator *)local_210);
  local_258[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_270,&local_288);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0x104,"void find_u16string()",local_258,
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2c0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
            ((iterator *)local_2a8,&local_2c0,&local_2d8,(char (*) [6])"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_300,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_318,(iterator *)local_2a8);
  local_2e8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_300,&local_318);
  where_5.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0x108,"void find_u16string()",local_2e8,
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_350,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_368,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
            ((iterator *)local_338,&local_350,&local_368,(wchar_t (*) [6])L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_390,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_3a8,(iterator *)local_338);
  local_378[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_390,&local_3a8);
  where_6.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0x10c,"void find_u16string()",local_378,
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_338);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3e0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3f8,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
            ((iterator *)local_3c8,&local_3e0,&local_3f8,(char16_t (*) [8])L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_420,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_438,(iterator *)local_3c8);
  local_408[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_420,&local_438);
  where_7.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0x110,"void find_u16string()",local_408,
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_420);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_470,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_488,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::lower_bound<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
            ((iterator *)local_458,&local_470,&local_488,(char32_t (*) [6])L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_470);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4b0,
             (basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_4c8,(iterator *)local_458);
  local_498[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_4b0,&local_4c8);
  local_4cc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/lower_bound_suite.cpp"
             ,0x114,"void find_u16string()",local_498,&local_4cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void find_u16string()
{
    variable data(u"charlie");
    {
        auto where = std::lower_bound(data.begin(), data.end(), null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), "alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        auto where = std::lower_bound(data.begin(), data.end(), U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
}